

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

void __thiscall bloaty::Options::Clear(Options *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1c4e34);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1c4e42);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1c4e50);
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::Clear
            ((RepeatedPtrField<bloaty::CustomDataSource> *)0x1c4e5e);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1c4e6c);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1c4e7d);
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmptyNoArena
                ((ArenaStringPtr *)0x1c4ecd);
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmptyNoArena
                ((ArenaStringPtr *)0x1c4eea);
    }
  }
  if ((uVar1 & 0xfc) != 0) {
    memset((void *)(in_RDI + 0xb8),0,0x20);
  }
  *(undefined8 *)(in_RDI + 0xd8) = 0x14;
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear
              ((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void Options::Clear() {
// @@protoc_insertion_point(message_clear_start:bloaty.Options)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  filename_.Clear();
  base_filename_.Clear();
  data_source_.Clear();
  custom_data_source_.Clear();
  debug_filename_.Clear();
  source_map_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      disassemble_function_.ClearNonDefaultToEmptyNoArena();
    }
    if (cached_has_bits & 0x00000002u) {
      source_filter_.ClearNonDefaultToEmptyNoArena();
    }
  }
  if (cached_has_bits & 0x000000fcu) {
    ::memset(&demangle_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&debug_fileoff_) -
        reinterpret_cast<char*>(&demangle_)) + sizeof(debug_fileoff_));
  }
  max_rows_per_level_ = PROTOBUF_LONGLONG(20);
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}